

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.cc
# Opt level: O0

Tensor * __thiscall
cnn::SimpleExecutionEngine::get_value(SimpleExecutionEngine *this,VariableIndex *i)

{
  uint uVar1;
  bool bVar2;
  uint *puVar3;
  size_type sVar4;
  reference pvVar5;
  VariableIndex *in_RSI;
  long *in_RDI;
  VariableIndex *in_stack_ffffffffffffffc8;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *this_00;
  VariableIndex *x;
  
  x = in_RSI;
  puVar3 = VariableIndex::operator_cast_to_unsigned_int_(in_RSI);
  uVar1 = *puVar3;
  sVar4 = std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::size
                    ((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)in_RDI[1]);
  if (sVar4 <= uVar1) {
    __assert_fail("i < cg.nodes.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/cnn/cnn/exec.cc"
                  ,0x1a,"virtual const Tensor &cnn::SimpleExecutionEngine::get_value(VariableIndex)"
                 );
  }
  bVar2 = boost::operators_impl::operator>=(x,in_stack_ffffffffffffffc8);
  if (bVar2) {
    (**(code **)(*in_RDI + 0x28))();
  }
  this_00 = (vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)(in_RDI + 2);
  puVar3 = VariableIndex::operator_cast_to_unsigned_int_(in_RSI);
  pvVar5 = std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                     (this_00,(ulong)*puVar3);
  return pvVar5;
}

Assistant:

const Tensor& SimpleExecutionEngine::get_value(VariableIndex i) {
  assert(i < cg.nodes.size());
  if (i >= num_nodes_evaluated) {
    incremental_forward();
  }
  return nfxs[i];
}